

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void home_carry(object *obj)

{
  _Bool _Var1;
  store *psVar2;
  object *obj1;
  
  psVar2 = store_home(player);
  if (psVar2 != (store *)0x0) {
    for (obj1 = psVar2->stock; obj1 != (object *)0x0; obj1 = obj1->next) {
      _Var1 = object_mergeable(obj1,obj,OSTACK_PACK);
      if (_Var1) {
        object_absorb(obj1,obj);
        return;
      }
    }
    if ((short)(ushort)psVar2->stock_num < psVar2->stock_size) {
      pile_insert(&psVar2->stock,obj);
      pile_insert(&psVar2->stock_k,obj->known);
      psVar2->stock_num = psVar2->stock_num + '\x01';
    }
  }
  return;
}

Assistant:

void home_carry(struct object *obj)
{
	struct object *temp_obj;
	struct store *store = store_home(player);

	if (!store) return;

	/* Check each existing object (try to combine) */
	for (temp_obj = store->stock; temp_obj; temp_obj = temp_obj->next) {
		/* The home acts just like the player */
		if (object_mergeable(temp_obj, obj, OSTACK_PACK)) {
			/* Save the new number of items */
			object_absorb(temp_obj, obj);
			return;
		}
	}

	/* No space? */
	if (store->stock_num >= store->stock_size) return;

	/* Insert the new object */
	pile_insert(&store->stock, obj);
	pile_insert(&store->stock_k, obj->known);
	store->stock_num++;
}